

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_work_stealing.cpp
# Opt level: O1

void oversubscription(size_t W)

{
  U *pUVar1;
  int *piVar2;
  Taskflow *pTVar3;
  code *pcVar4;
  double dVar5;
  __node_base _Var6;
  undefined8 this;
  char extraout_AL;
  bool bVar7;
  char extraout_AL_00;
  int iVar8;
  Node *pNVar9;
  long *plVar10;
  long lVar11;
  Executor *this_00;
  undefined4 extraout_XMM0_Da;
  undefined4 extraout_XMM0_Da_00;
  undefined4 extraout_XMM0_Da_01;
  undefined4 extraout_XMM0_Da_02;
  undefined4 uVar12;
  undefined4 extraout_XMM0_Db;
  undefined4 extraout_XMM0_Db_00;
  undefined4 extraout_XMM0_Db_01;
  undefined4 extraout_XMM0_Db_02;
  undefined4 uVar13;
  Task curr;
  Task prev;
  ResultBuilder DOCTEST_RB;
  atomic<unsigned_long> counter;
  unordered_set<int,_std::hash<int>,_std::equal_to<int>,_std::allocator<int>_> set;
  mutex mutex;
  Taskflow taskflow;
  Executor executor;
  _Head_base<0UL,_tf::Node_*,_false> local_370;
  undefined4 local_368;
  Result local_360;
  ulong local_340;
  ulong local_338;
  ulong local_330;
  Future<void> local_328;
  char *local_308;
  undefined2 local_300;
  undefined1 local_2f8;
  undefined7 uStack_2f7;
  char local_2e1;
  anon_union_24_2_13149d16_for_String_2 aStack_2e0;
  undefined1 local_2c8;
  char *local_2c0;
  char *local_2b8;
  undefined1 local_2b0 [16];
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Stack_2a0;
  _Hashtable<int,_int,_std::allocator<int>,_std::__detail::_Identity,_std::equal_to<int>,_std::hash<int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
  local_290;
  void *local_258;
  U UStack_250;
  U local_248;
  U UStack_240;
  U local_238;
  undefined1 local_230 [64];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_1f0;
  exception_ptr local_1e0;
  pointer puStack_1d8;
  pointer local_1d0;
  _Deque_base<std::shared_ptr<tf::Topology>,_std::allocator<std::shared_ptr<tf::Topology>_>_>
  _Stack_1c8;
  bool local_170;
  Executor local_168;
  
  local_230._0_8_ = &local_1e0;
  local_230._8_8_ = 0;
  local_230._16_8_ = 0;
  local_230._24_8_ = 0;
  local_230._32_8_ = (__pthread_internal_list *)0x0;
  local_230._40_8_ = (__pthread_internal_list *)0x0;
  local_230._48_8_ = local_230 + 0x40;
  local_230._56_8_ = 0;
  local_1f0._M_local_buf[0] = '\0';
  local_1e0._M_exception_object = (pointer)0x0;
  puStack_1d8 = (pointer)0x0;
  local_1d0 = (pointer)0x0;
  _Stack_1c8._M_impl.super__Deque_impl_data._M_map = (_Map_pointer)0x0;
  _Stack_1c8._M_impl.super__Deque_impl_data._M_map_size = 0;
  _Stack_1c8._M_impl.super__Deque_impl_data._M_start._M_cur = (_Elt_pointer)0x0;
  _Stack_1c8._M_impl.super__Deque_impl_data._M_start._M_first = (_Elt_pointer)0x0;
  _Stack_1c8._M_impl.super__Deque_impl_data._M_start._M_last = (_Elt_pointer)0x0;
  _Stack_1c8._M_impl.super__Deque_impl_data._M_start._M_node = (_Map_pointer)0x0;
  _Stack_1c8._M_impl.super__Deque_impl_data._M_finish._M_cur = (_Elt_pointer)0x0;
  _Stack_1c8._M_impl.super__Deque_impl_data._M_finish._M_first = (_Elt_pointer)0x0;
  _Stack_1c8._M_impl.super__Deque_impl_data._M_finish._M_last = (_Elt_pointer)0x0;
  _Stack_1c8._M_impl.super__Deque_impl_data._M_finish._M_node = (_Map_pointer)0x0;
  std::_Deque_base<std::shared_ptr<tf::Topology>,_std::allocator<std::shared_ptr<tf::Topology>_>_>::
  _M_initialize_map(&_Stack_1c8,0);
  local_170 = false;
  local_2b0._8_8_ = (pointer)0x0;
  p_Stack_2a0 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  tf::Executor::Executor(&local_168,W,(shared_ptr<tf::WorkerInterface> *)(local_2b0 + 8));
  if (p_Stack_2a0 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Stack_2a0);
  }
  local_2b0._0_4_ = 0;
  local_2b0._4_4_ = (__atomic_base<int>)0x0;
  local_238.buff[0] = 0;
  local_238.buff[1] = 0;
  local_238.buff[2] = 0;
  local_238.buff[3] = 0;
  local_238.buff[4] = 0;
  local_238.buff[5] = 0;
  local_238.buff[6] = 0;
  local_238.buff[7] = 0;
  local_248.buff[0] = 0;
  local_248.buff[1] = 0;
  local_248.buff[2] = 0;
  local_248.buff[3] = 0;
  local_248.buff[4] = 0;
  local_248.buff[5] = 0;
  local_248.buff[6] = 0;
  local_248.buff[7] = 0;
  UStack_240.buff[0] = 0;
  UStack_240.buff[1] = 0;
  UStack_240.buff[2] = 0;
  UStack_240.buff[3] = 0;
  UStack_240.buff[4] = 0;
  UStack_240.buff[5] = 0;
  UStack_240.buff[6] = 0;
  UStack_240.buff[7] = 0;
  local_258 = (void *)0x0;
  UStack_250.buff[0] = 0;
  UStack_250.buff[1] = 0;
  UStack_250.buff[2] = 0;
  UStack_250.buff[3] = 0;
  UStack_250.buff[4] = 0;
  UStack_250.buff[5] = 0;
  UStack_250.buff[6] = 0;
  UStack_250.buff[7] = 0;
  local_290._M_buckets = (__buckets_ptr)((long)&local_290 + 0x30);
  local_290._M_bucket_count = 1;
  local_290._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  local_290._M_element_count = 0;
  local_290._M_rehash_policy._M_max_load_factor = 1.0;
  local_290._M_rehash_policy._M_next_resize = 0;
  local_290._M_single_bucket = (__node_base_ptr)0x0;
  local_338 = W >> 1;
  if (1 < W) {
    local_340 = 0;
    do {
      local_360._0_8_ = (Node *)0x0;
      lVar11 = 100;
      do {
        this = local_230._0_8_;
        local_370._M_head_impl = (Node *)local_360._0_8_;
        pNVar9 = (Node *)operator_new(0xd8);
        pNVar9->_nstate = 0;
        pNVar9->_estate = (__atomic_base<int>)0x0;
        (pNVar9->_name)._M_dataplus._M_p = (pointer)&(pNVar9->_name).field_2;
        (pNVar9->_name)._M_string_length = 0;
        (pNVar9->_name).field_2._M_local_buf[0] = '\0';
        pUVar1 = &(pNVar9->_edges).super_SmallVectorImpl<tf::Node_*>.
                  super_SmallVectorTemplateBase<tf::Node_*,_true>.
                  super_SmallVectorTemplateCommon<tf::Node_*,_void>.FirstEl;
        pNVar9->_data = (void *)0x0;
        pNVar9->_topology = (Topology *)0x0;
        pNVar9->_parent = (Node *)0x0;
        pNVar9->_num_successors = 0;
        (pNVar9->_edges).super_SmallVectorImpl<tf::Node_*>.
        super_SmallVectorTemplateBase<tf::Node_*,_true>.
        super_SmallVectorTemplateCommon<tf::Node_*,_void>.super_SmallVectorBase.BeginX = pUVar1;
        (pNVar9->_edges).super_SmallVectorImpl<tf::Node_*>.
        super_SmallVectorTemplateBase<tf::Node_*,_true>.
        super_SmallVectorTemplateCommon<tf::Node_*,_void>.super_SmallVectorBase.EndX = pUVar1;
        (pNVar9->_edges).super_SmallVectorImpl<tf::Node_*>.
        super_SmallVectorTemplateBase<tf::Node_*,_true>.
        super_SmallVectorTemplateCommon<tf::Node_*,_void>.super_SmallVectorBase.CapacityX =
             &pNVar9->_join_counter;
        (pNVar9->_join_counter).super___atomic_base<unsigned_long>._M_i = 0;
        *(undefined8 *)
         &(pNVar9->_handle).
          super__Variant_base<std::monostate,_tf::Node::Static,_tf::Node::Runtime,_tf::Node::Subflow,_tf::Node::Condition,_tf::Node::MultiCondition,_tf::Node::Module,_tf::Node::Async,_tf::Node::DependentAsync>
          .
          super__Move_assign_alias<std::monostate,_tf::Node::Static,_tf::Node::Runtime,_tf::Node::Subflow,_tf::Node::Condition,_tf::Node::MultiCondition,_tf::Node::Module,_tf::Node::Async,_tf::Node::DependentAsync>
          .
          super__Copy_assign_alias<std::monostate,_tf::Node::Static,_tf::Node::Runtime,_tf::Node::Subflow,_tf::Node::Condition,_tf::Node::MultiCondition,_tf::Node::Module,_tf::Node::Async,_tf::Node::DependentAsync>
          .
          super__Move_ctor_alias<std::monostate,_tf::Node::Static,_tf::Node::Runtime,_tf::Node::Subflow,_tf::Node::Condition,_tf::Node::MultiCondition,_tf::Node::Module,_tf::Node::Async,_tf::Node::DependentAsync>
          .
          super__Copy_ctor_alias<std::monostate,_tf::Node::Static,_tf::Node::Runtime,_tf::Node::Subflow,_tf::Node::Condition,_tf::Node::MultiCondition,_tf::Node::Module,_tf::Node::Async,_tf::Node::DependentAsync>
          .
          super__Variant_storage_alias<std::monostate,_tf::Node::Static,_tf::Node::Runtime,_tf::Node::Subflow,_tf::Node::Condition,_tf::Node::MultiCondition,_tf::Node::Module,_tf::Node::Async,_tf::Node::DependentAsync>
          ._M_u = 0;
        *(undefined8 *)
         ((long)&(pNVar9->_handle).
                 super__Variant_base<std::monostate,_tf::Node::Static,_tf::Node::Runtime,_tf::Node::Subflow,_tf::Node::Condition,_tf::Node::MultiCondition,_tf::Node::Module,_tf::Node::Async,_tf::Node::DependentAsync>
                 .
                 super__Move_assign_alias<std::monostate,_tf::Node::Static,_tf::Node::Runtime,_tf::Node::Subflow,_tf::Node::Condition,_tf::Node::MultiCondition,_tf::Node::Module,_tf::Node::Async,_tf::Node::DependentAsync>
                 .
                 super__Copy_assign_alias<std::monostate,_tf::Node::Static,_tf::Node::Runtime,_tf::Node::Subflow,_tf::Node::Condition,_tf::Node::MultiCondition,_tf::Node::Module,_tf::Node::Async,_tf::Node::DependentAsync>
                 .
                 super__Move_ctor_alias<std::monostate,_tf::Node::Static,_tf::Node::Runtime,_tf::Node::Subflow,_tf::Node::Condition,_tf::Node::MultiCondition,_tf::Node::Module,_tf::Node::Async,_tf::Node::DependentAsync>
                 .
                 super__Copy_ctor_alias<std::monostate,_tf::Node::Static,_tf::Node::Runtime,_tf::Node::Subflow,_tf::Node::Condition,_tf::Node::MultiCondition,_tf::Node::Module,_tf::Node::Async,_tf::Node::DependentAsync>
                 .
                 super__Variant_storage_alias<std::monostate,_tf::Node::Static,_tf::Node::Runtime,_tf::Node::Subflow,_tf::Node::Condition,_tf::Node::MultiCondition,_tf::Node::Module,_tf::Node::Async,_tf::Node::DependentAsync>
         + 8) = 0;
        *(undefined8 *)
         ((long)&(pNVar9->_handle).
                 super__Variant_base<std::monostate,_tf::Node::Static,_tf::Node::Runtime,_tf::Node::Subflow,_tf::Node::Condition,_tf::Node::MultiCondition,_tf::Node::Module,_tf::Node::Async,_tf::Node::DependentAsync>
                 .
                 super__Move_assign_alias<std::monostate,_tf::Node::Static,_tf::Node::Runtime,_tf::Node::Subflow,_tf::Node::Condition,_tf::Node::MultiCondition,_tf::Node::Module,_tf::Node::Async,_tf::Node::DependentAsync>
                 .
                 super__Copy_assign_alias<std::monostate,_tf::Node::Static,_tf::Node::Runtime,_tf::Node::Subflow,_tf::Node::Condition,_tf::Node::MultiCondition,_tf::Node::Module,_tf::Node::Async,_tf::Node::DependentAsync>
                 .
                 super__Move_ctor_alias<std::monostate,_tf::Node::Static,_tf::Node::Runtime,_tf::Node::Subflow,_tf::Node::Condition,_tf::Node::MultiCondition,_tf::Node::Module,_tf::Node::Async,_tf::Node::DependentAsync>
                 .
                 super__Copy_ctor_alias<std::monostate,_tf::Node::Static,_tf::Node::Runtime,_tf::Node::Subflow,_tf::Node::Condition,_tf::Node::MultiCondition,_tf::Node::Module,_tf::Node::Async,_tf::Node::DependentAsync>
                 .
                 super__Variant_storage_alias<std::monostate,_tf::Node::Static,_tf::Node::Runtime,_tf::Node::Subflow,_tf::Node::Condition,_tf::Node::MultiCondition,_tf::Node::Module,_tf::Node::Async,_tf::Node::DependentAsync>
         + 0x10) = 0;
        *(undefined8 *)
         ((long)&(pNVar9->_handle).
                 super__Variant_base<std::monostate,_tf::Node::Static,_tf::Node::Runtime,_tf::Node::Subflow,_tf::Node::Condition,_tf::Node::MultiCondition,_tf::Node::Module,_tf::Node::Async,_tf::Node::DependentAsync>
                 .
                 super__Move_assign_alias<std::monostate,_tf::Node::Static,_tf::Node::Runtime,_tf::Node::Subflow,_tf::Node::Condition,_tf::Node::MultiCondition,_tf::Node::Module,_tf::Node::Async,_tf::Node::DependentAsync>
                 .
                 super__Copy_assign_alias<std::monostate,_tf::Node::Static,_tf::Node::Runtime,_tf::Node::Subflow,_tf::Node::Condition,_tf::Node::MultiCondition,_tf::Node::Module,_tf::Node::Async,_tf::Node::DependentAsync>
                 .
                 super__Move_ctor_alias<std::monostate,_tf::Node::Static,_tf::Node::Runtime,_tf::Node::Subflow,_tf::Node::Condition,_tf::Node::MultiCondition,_tf::Node::Module,_tf::Node::Async,_tf::Node::DependentAsync>
                 .
                 super__Copy_ctor_alias<std::monostate,_tf::Node::Static,_tf::Node::Runtime,_tf::Node::Subflow,_tf::Node::Condition,_tf::Node::MultiCondition,_tf::Node::Module,_tf::Node::Async,_tf::Node::DependentAsync>
                 .
                 super__Variant_storage_alias<std::monostate,_tf::Node::Static,_tf::Node::Runtime,_tf::Node::Subflow,_tf::Node::Condition,_tf::Node::MultiCondition,_tf::Node::Module,_tf::Node::Async,_tf::Node::DependentAsync>
         + 0x18) = 0;
        plVar10 = (long *)operator_new(0x20);
        *plVar10 = (long)&local_258;
        plVar10[1] = (long)(local_2b0 + 0x20);
        plVar10[2] = (long)&local_168;
        plVar10[3] = (long)local_2b0;
        *(long **)&(pNVar9->_handle).
                   super__Variant_base<std::monostate,_tf::Node::Static,_tf::Node::Runtime,_tf::Node::Subflow,_tf::Node::Condition,_tf::Node::MultiCondition,_tf::Node::Module,_tf::Node::Async,_tf::Node::DependentAsync>
                   .
                   super__Move_assign_alias<std::monostate,_tf::Node::Static,_tf::Node::Runtime,_tf::Node::Subflow,_tf::Node::Condition,_tf::Node::MultiCondition,_tf::Node::Module,_tf::Node::Async,_tf::Node::DependentAsync>
                   .
                   super__Copy_assign_alias<std::monostate,_tf::Node::Static,_tf::Node::Runtime,_tf::Node::Subflow,_tf::Node::Condition,_tf::Node::MultiCondition,_tf::Node::Module,_tf::Node::Async,_tf::Node::DependentAsync>
                   .
                   super__Move_ctor_alias<std::monostate,_tf::Node::Static,_tf::Node::Runtime,_tf::Node::Subflow,_tf::Node::Condition,_tf::Node::MultiCondition,_tf::Node::Module,_tf::Node::Async,_tf::Node::DependentAsync>
                   .
                   super__Copy_ctor_alias<std::monostate,_tf::Node::Static,_tf::Node::Runtime,_tf::Node::Subflow,_tf::Node::Condition,_tf::Node::MultiCondition,_tf::Node::Module,_tf::Node::Async,_tf::Node::DependentAsync>
                   .
                   super__Variant_storage_alias<std::monostate,_tf::Node::Static,_tf::Node::Runtime,_tf::Node::Subflow,_tf::Node::Condition,_tf::Node::MultiCondition,_tf::Node::Module,_tf::Node::Async,_tf::Node::DependentAsync>
                   ._M_u = plVar10;
        *(code **)((long)&(pNVar9->_handle).
                          super__Variant_base<std::monostate,_tf::Node::Static,_tf::Node::Runtime,_tf::Node::Subflow,_tf::Node::Condition,_tf::Node::MultiCondition,_tf::Node::Module,_tf::Node::Async,_tf::Node::DependentAsync>
                          .
                          super__Move_assign_alias<std::monostate,_tf::Node::Static,_tf::Node::Runtime,_tf::Node::Subflow,_tf::Node::Condition,_tf::Node::MultiCondition,_tf::Node::Module,_tf::Node::Async,_tf::Node::DependentAsync>
                          .
                          super__Copy_assign_alias<std::monostate,_tf::Node::Static,_tf::Node::Runtime,_tf::Node::Subflow,_tf::Node::Condition,_tf::Node::MultiCondition,_tf::Node::Module,_tf::Node::Async,_tf::Node::DependentAsync>
                          .
                          super__Move_ctor_alias<std::monostate,_tf::Node::Static,_tf::Node::Runtime,_tf::Node::Subflow,_tf::Node::Condition,_tf::Node::MultiCondition,_tf::Node::Module,_tf::Node::Async,_tf::Node::DependentAsync>
                          .
                          super__Copy_ctor_alias<std::monostate,_tf::Node::Static,_tf::Node::Runtime,_tf::Node::Subflow,_tf::Node::Condition,_tf::Node::MultiCondition,_tf::Node::Module,_tf::Node::Async,_tf::Node::DependentAsync>
                          .
                          super__Variant_storage_alias<std::monostate,_tf::Node::Static,_tf::Node::Runtime,_tf::Node::Subflow,_tf::Node::Condition,_tf::Node::MultiCondition,_tf::Node::Module,_tf::Node::Async,_tf::Node::DependentAsync>
                  + 0x18) =
             std::
             _Function_handler<void_(),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/taskflow[P]taskflow/unittests/test_work_stealing.cpp:863:31)>
             ::_M_invoke;
        *(code **)((long)&(pNVar9->_handle).
                          super__Variant_base<std::monostate,_tf::Node::Static,_tf::Node::Runtime,_tf::Node::Subflow,_tf::Node::Condition,_tf::Node::MultiCondition,_tf::Node::Module,_tf::Node::Async,_tf::Node::DependentAsync>
                          .
                          super__Move_assign_alias<std::monostate,_tf::Node::Static,_tf::Node::Runtime,_tf::Node::Subflow,_tf::Node::Condition,_tf::Node::MultiCondition,_tf::Node::Module,_tf::Node::Async,_tf::Node::DependentAsync>
                          .
                          super__Copy_assign_alias<std::monostate,_tf::Node::Static,_tf::Node::Runtime,_tf::Node::Subflow,_tf::Node::Condition,_tf::Node::MultiCondition,_tf::Node::Module,_tf::Node::Async,_tf::Node::DependentAsync>
                          .
                          super__Move_ctor_alias<std::monostate,_tf::Node::Static,_tf::Node::Runtime,_tf::Node::Subflow,_tf::Node::Condition,_tf::Node::MultiCondition,_tf::Node::Module,_tf::Node::Async,_tf::Node::DependentAsync>
                          .
                          super__Copy_ctor_alias<std::monostate,_tf::Node::Static,_tf::Node::Runtime,_tf::Node::Subflow,_tf::Node::Condition,_tf::Node::MultiCondition,_tf::Node::Module,_tf::Node::Async,_tf::Node::DependentAsync>
                          .
                          super__Variant_storage_alias<std::monostate,_tf::Node::Static,_tf::Node::Runtime,_tf::Node::Subflow,_tf::Node::Condition,_tf::Node::MultiCondition,_tf::Node::Module,_tf::Node::Async,_tf::Node::DependentAsync>
                  + 0x10) =
             std::
             _Function_handler<void_(),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/taskflow[P]taskflow/unittests/test_work_stealing.cpp:863:31)>
             ::_M_manager;
        *(__index_type *)
         ((long)&(pNVar9->_handle).
                 super__Variant_base<std::monostate,_tf::Node::Static,_tf::Node::Runtime,_tf::Node::Subflow,_tf::Node::Condition,_tf::Node::MultiCondition,_tf::Node::Module,_tf::Node::Async,_tf::Node::DependentAsync>
                 .
                 super__Move_assign_alias<std::monostate,_tf::Node::Static,_tf::Node::Runtime,_tf::Node::Subflow,_tf::Node::Condition,_tf::Node::MultiCondition,_tf::Node::Module,_tf::Node::Async,_tf::Node::DependentAsync>
                 .
                 super__Copy_assign_alias<std::monostate,_tf::Node::Static,_tf::Node::Runtime,_tf::Node::Subflow,_tf::Node::Condition,_tf::Node::MultiCondition,_tf::Node::Module,_tf::Node::Async,_tf::Node::DependentAsync>
                 .
                 super__Move_ctor_alias<std::monostate,_tf::Node::Static,_tf::Node::Runtime,_tf::Node::Subflow,_tf::Node::Condition,_tf::Node::MultiCondition,_tf::Node::Module,_tf::Node::Async,_tf::Node::DependentAsync>
                 .
                 super__Copy_ctor_alias<std::monostate,_tf::Node::Static,_tf::Node::Runtime,_tf::Node::Subflow,_tf::Node::Condition,_tf::Node::MultiCondition,_tf::Node::Module,_tf::Node::Async,_tf::Node::DependentAsync>
                 .
                 super__Variant_storage_alias<std::monostate,_tf::Node::Static,_tf::Node::Runtime,_tf::Node::Subflow,_tf::Node::Condition,_tf::Node::MultiCondition,_tf::Node::Module,_tf::Node::Async,_tf::Node::DependentAsync>
         + 0x38) = '\x01';
        (pNVar9->_semaphores)._M_t.
        super___uniq_ptr_impl<tf::Node::Semaphores,_std::default_delete<tf::Node::Semaphores>_>._M_t
        .super__Tuple_impl<0UL,_tf::Node::Semaphores_*,_std::default_delete<tf::Node::Semaphores>_>.
        super__Head_base<0UL,_tf::Node::Semaphores_*,_false>._M_head_impl = (Semaphores *)0x0;
        (pNVar9->_exception_ptr)._M_exception_object = (void *)0x0;
        local_328.super_future<void>.super___basic_future<void>._M_state.
        super___shared_ptr<std::__future_base::_State_baseV2,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
             (element_type *)pNVar9;
        std::
        vector<std::unique_ptr<tf::Node,std::default_delete<tf::Node>>,std::allocator<std::unique_ptr<tf::Node,std::default_delete<tf::Node>>>>
        ::emplace_back<std::unique_ptr<tf::Node,std::default_delete<tf::Node>>>
                  ((vector<std::unique_ptr<tf::Node,std::default_delete<tf::Node>>,std::allocator<std::unique_ptr<tf::Node,std::default_delete<tf::Node>>>>
                    *)this,(unique_ptr<tf::Node,_std::default_delete<tf::Node>_> *)&local_328);
        if ((Node *)local_328.super_future<void>.super___basic_future<void>._M_state.
                    super___shared_ptr<std::__future_base::_State_baseV2,_(__gnu_cxx::_Lock_policy)2>
                    ._M_ptr != (Node *)0x0) {
          std::default_delete<tf::Node>::operator()
                    ((default_delete<tf::Node> *)&local_328,
                     (Node *)local_328.super_future<void>.super___basic_future<void>._M_state.
                             super___shared_ptr<std::__future_base::_State_baseV2,_(__gnu_cxx::_Lock_policy)2>
                             ._M_ptr);
        }
        local_370._M_head_impl =
             (((vector<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>,_std::allocator<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>_>_>
                *)this)->
             super__Vector_base<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>,_std::allocator<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>_>_>
             )._M_impl.super__Vector_impl_data._M_finish[-1]._M_t.
             super___uniq_ptr_impl<tf::Node,_std::default_delete<tf::Node>_>._M_t.
             super__Tuple_impl<0UL,_tf::Node_*,_std::default_delete<tf::Node>_>.
             super__Head_base<0UL,_tf::Node_*,_false>._M_head_impl;
        if (lVar11 != 100) {
          tf::Task::succeed<tf::Task&>((Task *)&local_370,(Task *)&local_360);
        }
        local_360._0_8_ = local_370._M_head_impl;
        lVar11 = lVar11 + -1;
      } while (lVar11 != 0);
      local_340 = local_340 + 1;
    } while (local_340 != local_338);
  }
  local_340 = local_338 * 100;
  lVar11 = 1;
  _Var6._M_nxt = local_290._M_before_begin._M_nxt;
  while( true ) {
    while ((Topology *)_Var6._M_nxt != (Topology *)0x0) {
      pTVar3 = *(Taskflow **)&((Taskflow *)_Var6._M_nxt)->super_FlowBuilder;
      operator_delete(_Var6._M_nxt,0x10);
      _Var6._M_nxt = (_Hash_node_base *)pTVar3;
    }
    memset(local_290._M_buckets,0,local_290._M_bucket_count << 3);
    local_290._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
    local_290._M_element_count = 0;
    local_360._0_8_ = (Node *)0x1;
    this_00 = &local_168;
    tf::Executor::
    run_until<tf::Executor::run_n<tf::Executor::run(tf::Taskflow&)::_lambda()_1_>(tf::Taskflow&,unsigned_long,tf::Executor::run(tf::Taskflow&)::_lambda()_1_&&)::_lambda()_1_,tf::Executor::run(tf::Taskflow&)::_lambda()_1_>
              (&local_328,this_00,(Taskflow *)local_230,(anon_class_8_1_69701ed9 *)&local_360,
               (anon_class_1_0_00000001 *)&local_370);
    if ((Node *)local_328.super_future<void>.super___basic_future<void>._M_state.
                super___shared_ptr<std::__future_base::_State_baseV2,_(__gnu_cxx::_Lock_policy)2>.
                _M_ptr == (Node *)0x0) break;
    std::__future_base::_State_baseV2::wait
              (local_328.super_future<void>.super___basic_future<void>._M_state.
               super___shared_ptr<std::__future_base::_State_baseV2,_(__gnu_cxx::_Lock_policy)2>.
               _M_ptr,this_00);
    plVar10 = (long *)CONCAT44(local_328._topology.
                               super___weak_ptr<tf::Topology,_(__gnu_cxx::_Lock_policy)2>.
                               _M_refcount._M_pi._4_4_,
                               local_328._topology.
                               super___weak_ptr<tf::Topology,_(__gnu_cxx::_Lock_policy)2>.
                               _M_refcount._M_pi._0_4_);
    if (plVar10 != (long *)0x0) {
      if (__libc_single_threaded == '\0') {
        LOCK();
        piVar2 = (int *)((long)plVar10 + 0xc);
        iVar8 = *piVar2;
        *piVar2 = *piVar2 + -1;
        UNLOCK();
      }
      else {
        iVar8 = *(int *)((long)plVar10 + 0xc);
        *(int *)((long)plVar10 + 0xc) = iVar8 + -1;
      }
      if (iVar8 == 1) {
        (**(code **)(*plVar10 + 0x18))();
      }
    }
    if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
        CONCAT44(local_328.super_future<void>.super___basic_future<void>._M_state.
                 super___shared_ptr<std::__future_base::_State_baseV2,_(__gnu_cxx::_Lock_policy)2>.
                 _M_refcount._M_pi._4_4_,
                 (Enum)local_328.super_future<void>.super___basic_future<void>._M_state.
                       super___shared_ptr<std::__future_base::_State_baseV2,_(__gnu_cxx::_Lock_policy)2>
                       ._M_refcount._M_pi) != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                 CONCAT44(local_328.super_future<void>.super___basic_future<void>._M_state.
                          super___shared_ptr<std::__future_base::_State_baseV2,_(__gnu_cxx::_Lock_policy)2>
                          ._M_refcount._M_pi._4_4_,
                          (Enum)local_328.super_future<void>.super___basic_future<void>._M_state.
                                super___shared_ptr<std::__future_base::_State_baseV2,_(__gnu_cxx::_Lock_policy)2>
                                ._M_refcount._M_pi));
    }
    local_2f8 = 0;
    local_2e1 = '\x17';
    aStack_2e0.buf[0] = '\0';
    aStack_2e0.buf[0x17] = '\x17';
    local_328.super_future<void>.super___basic_future<void>._M_state.
    super___shared_ptr<std::__future_base::_State_baseV2,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
         *(element_type **)(doctest::detail::g_cs + 0x20);
    local_328.super_future<void>.super___basic_future<void>._M_state.
    super___shared_ptr<std::__future_base::_State_baseV2,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
    _M_pi._0_4_ = DT_REQUIRE;
    local_328._topology.super___weak_ptr<tf::Topology,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
         (element_type *)0x13103f;
    local_328._topology.super___weak_ptr<tf::Topology,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
    ._0_4_ = 0x373;
    local_308 = "counter == 100*(W/2)*t";
    local_300 = 1;
    local_2c8 = 0;
    local_2c0 = "";
    local_2b8 = "";
    local_370._M_head_impl = (Node *)local_2b0;
    local_368 = 0xc;
    local_330 = local_340 * lVar11;
    doctest::detail::Expression_lhs<std::atomic<unsigned_long>const&>::operator==
              (&local_360,(Expression_lhs<std::atomic<unsigned_long>const&> *)&local_370,&local_330)
    ;
    doctest::String::operator=
              ((String *)&aStack_2e0.data,(String *)&local_360.m_decomp.field_0.data);
    local_300 = CONCAT11(local_300._1_1_,local_360.m_passed) ^ 1;
    uVar12 = extraout_XMM0_Da;
    uVar13 = extraout_XMM0_Db;
    if ((local_360.m_decomp.field_0.buf[0x17] < '\0') &&
       (local_360.m_decomp.field_0.data.ptr != (char *)0x0)) {
      operator_delete__(local_360.m_decomp.field_0.data.ptr);
      uVar12 = extraout_XMM0_Da_00;
      uVar13 = extraout_XMM0_Db_00;
    }
    dVar5 = doctest::detail::ResultBuilder::log
                      ((ResultBuilder *)&local_328,(double)CONCAT44(uVar13,uVar12));
    if (extraout_AL != '\0') {
      pcVar4 = (code *)swi(3);
      (*pcVar4)(SUB84(dVar5,0));
      return;
    }
    if (((char)local_300 == '\x01') &&
       (bVar7 = doctest::detail::checkIfShouldThrow
                          ((Enum)local_328.super_future<void>.super___basic_future<void>._M_state.
                                 super___shared_ptr<std::__future_base::_State_baseV2,_(__gnu_cxx::_Lock_policy)2>
                                 ._M_refcount._M_pi), bVar7)) goto LAB_00115eb6;
    if ((aStack_2e0.buf[0x17] < '\0') &&
       ((void *)CONCAT71(aStack_2e0._1_7_,aStack_2e0.buf[0]) != (void *)0x0)) {
      operator_delete__((void *)CONCAT71(aStack_2e0._1_7_,aStack_2e0.buf[0]));
    }
    if ((local_2e1 < '\0') && ((void *)CONCAT71(uStack_2f7,local_2f8) != (void *)0x0)) {
      operator_delete__((void *)CONCAT71(uStack_2f7,local_2f8));
    }
    local_2f8 = 0;
    local_2e1 = '\x17';
    aStack_2e0.buf[0] = '\0';
    aStack_2e0.buf[0x17] = '\x17';
    local_328.super_future<void>.super___basic_future<void>._M_state.
    super___shared_ptr<std::__future_base::_State_baseV2,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
         *(element_type **)(doctest::detail::g_cs + 0x20);
    local_328.super_future<void>.super___basic_future<void>._M_state.
    super___shared_ptr<std::__future_base::_State_baseV2,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
    _M_pi._0_4_ = DT_REQUIRE;
    local_328._topology.super___weak_ptr<tf::Topology,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
         (element_type *)0x13103f;
    local_328._topology.super___weak_ptr<tf::Topology,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
    ._0_4_ = 0x374;
    local_308 = "set.size() <= W/2";
    local_300 = 1;
    local_2c8 = 0;
    local_2c0 = "";
    local_2b8 = "";
    local_370._M_head_impl = (Node *)local_290._M_element_count;
    local_368 = 0xc;
    local_330 = local_338;
    (((void)(((doctest::detail::declval<unsigned_long_const>)())<=((doctest::detail::
    declval<unsigned_long>)()))),doctest::detail::Result{})doctest::detail::
    Expression_lhs<unsigned_long_const>::operator<=
              (&local_360,(Expression_lhs<unsigned_long_const> *)&local_370,&local_330);
    doctest::String::operator=
              ((String *)&aStack_2e0.data,(String *)&local_360.m_decomp.field_0.data);
    local_300 = CONCAT11(local_300._1_1_,local_360.m_passed) ^ 1;
    uVar12 = extraout_XMM0_Da_01;
    uVar13 = extraout_XMM0_Db_01;
    if ((local_360.m_decomp.field_0.buf[0x17] < '\0') &&
       (local_360.m_decomp.field_0.data.ptr != (char *)0x0)) {
      operator_delete__(local_360.m_decomp.field_0.data.ptr);
      uVar12 = extraout_XMM0_Da_02;
      uVar13 = extraout_XMM0_Db_02;
    }
    dVar5 = doctest::detail::ResultBuilder::log
                      ((ResultBuilder *)&local_328,(double)CONCAT44(uVar13,uVar12));
    if (extraout_AL_00 != '\0') {
      pcVar4 = (code *)swi(3);
      (*pcVar4)(SUB84(dVar5,0));
      return;
    }
    if (((char)local_300 == '\x01') &&
       (bVar7 = doctest::detail::checkIfShouldThrow
                          ((Enum)local_328.super_future<void>.super___basic_future<void>._M_state.
                                 super___shared_ptr<std::__future_base::_State_baseV2,_(__gnu_cxx::_Lock_policy)2>
                                 ._M_refcount._M_pi), bVar7)) {
      doctest::detail::throwException();
    }
    if ((aStack_2e0.buf[0x17] < '\0') &&
       ((void *)CONCAT71(aStack_2e0._1_7_,aStack_2e0.buf[0]) != (void *)0x0)) {
      operator_delete__((void *)CONCAT71(aStack_2e0._1_7_,aStack_2e0.buf[0]));
    }
    if ((local_2e1 < '\0') && ((void *)CONCAT71(uStack_2f7,local_2f8) != (void *)0x0)) {
      operator_delete__((void *)CONCAT71(uStack_2f7,local_2f8));
    }
    lVar11 = lVar11 + 1;
    _Var6._M_nxt = local_290._M_before_begin._M_nxt;
    if (lVar11 == 0x65) {
      std::
      _Hashtable<int,_int,_std::allocator<int>,_std::__detail::_Identity,_std::equal_to<int>,_std::hash<int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
      ::~_Hashtable((_Hashtable<int,_int,_std::allocator<int>,_std::__detail::_Identity,_std::equal_to<int>,_std::hash<int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
                     *)(local_2b0 + 0x20));
      tf::Executor::~Executor(&local_168);
      tf::Taskflow::~Taskflow((Taskflow *)local_230);
      return;
    }
  }
  std::__throw_future_error(3);
LAB_00115eb6:
  doctest::detail::throwException();
}

Assistant:

void oversubscription(size_t W) {

  tf::Taskflow taskflow;
  tf::Executor executor(W);

  std::atomic<size_t> counter{0};
  
  // all worker must be involved
  std::mutex mutex;
  std::unordered_set<int> set;

  for(size_t n = 0; n<W/2; n++) { 
  
    tf::Task prev, curr;

    for(size_t l=0; l<100; l++) {

      curr = taskflow.emplace([&](){
        // record worker
        {
          std::scoped_lock lock(mutex);
          set.insert(executor.this_worker_id());
        }
        counter.fetch_add(1, std::memory_order_relaxed);
      });

      if(l) {
        curr.succeed(prev);
      }

      prev = curr;
    }
  }

  for(size_t t=1; t<=100; t++) {
    set.clear();
    executor.run(taskflow).wait();
    REQUIRE(counter == 100*(W/2)*t);
    REQUIRE(set.size() <= W/2);
  }
}